

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoder.h
# Opt level: O0

int encoder_append_var(ndn_encoder_t *encoder,uint32_t var)

{
  uint8_t uVar1;
  uint8_t uVar2;
  uint uVar3;
  uint32_t rest_size;
  uint32_t var_local;
  ndn_encoder_t *encoder_local;
  
  uVar3 = encoder->output_max_size - encoder->offset;
  uVar1 = (uint8_t)var;
  if ((var < 0xfd) && (encoder->output_max_size != encoder->offset)) {
    encoder->output_value[encoder->offset] = uVar1;
    encoder->offset = encoder->offset + 1;
  }
  else {
    uVar2 = (uint8_t)(var >> 8);
    if ((var < 0x10000) && (2 < uVar3)) {
      encoder->output_value[encoder->offset] = 0xfd;
      encoder->output_value[encoder->offset + 1] = uVar2;
      encoder->output_value[encoder->offset + 2] = uVar1;
      encoder->offset = encoder->offset + 3;
    }
    else {
      if (uVar3 < 5) {
        return -0xe;
      }
      encoder->output_value[encoder->offset] = 0xfe;
      encoder->output_value[encoder->offset + 1] = (uint8_t)(var >> 0x18);
      encoder->output_value[encoder->offset + 2] = (uint8_t)(var >> 0x10);
      encoder->output_value[encoder->offset + 3] = uVar2;
      encoder->output_value[encoder->offset + 4] = uVar1;
      encoder->offset = encoder->offset + 5;
    }
  }
  return 0;
}

Assistant:

static inline int
encoder_append_var(ndn_encoder_t* encoder, uint32_t var)
{
  uint32_t rest_size = encoder->output_max_size - encoder->offset;
  if (var < 253 && rest_size >= 1) {
    encoder->output_value[encoder->offset] = var & 0xFF;
    encoder->offset += 1;
  }
  else if (var <= 0xFFFF && rest_size >= 3) {
    encoder->output_value[encoder->offset] = 253;
    encoder->output_value[encoder->offset + 1] = (var >> 8) & 0xFF;
    encoder->output_value[encoder->offset + 2] = var & 0xFF;
    encoder->offset += 3;
  }
  else if (var <= 0xFFFFFFFF && rest_size >= 5) {
    encoder->output_value[encoder->offset] = 254;
    encoder->output_value[encoder->offset + 1] = (var >> 24) & 0xFF;
    encoder->output_value[encoder->offset + 2] = (var >> 16) & 0xFF;
    encoder->output_value[encoder->offset + 3] = (var >> 8) & 0xFF;
    encoder->output_value[encoder->offset + 4] = var & 0xFF;
    encoder->offset += 5;
  }
  else {
    return NDN_OVERSIZE_VAR;
  }
  return 0;
}